

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O3

promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
* __thiscall
ising::free_energy::square::
finite_count<unsigned_int,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>>
          (promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
           *__return_storage_ptr__,square *this,uint Lx,uint Ly,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy,fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                  *beta,
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
          *h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong *__s;
  int32_t iVar4;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
  *ppVar5;
  uint uVar6;
  void *pvVar7;
  undefined8 *puVar8;
  ulong uVar9;
  invalid_argument *piVar10;
  undefined4 in_register_0000000c;
  type pnVar11;
  long lVar12;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *cr;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *cr_00;
  ulong uVar13;
  uint uVar14;
  vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  J;
  graph graph;
  real_t mag;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  retval;
  basis basis;
  unitcell unitcell;
  real_t energy;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
  mcr;
  value_t Z;
  subtract_immediates local_c09;
  ulong local_c08;
  int local_c00;
  uint local_bfc;
  undefined1 local_bf8 [16];
  uint local_be8 [2];
  uint auStack_be0 [2];
  uint local_bd8 [2];
  int local_bd0;
  bool local_bcc;
  fpclass_type local_bc8;
  int32_t iStack_bc4;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *local_bb8;
  expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_bb0;
  vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  local_ba0;
  graph local_b88;
  cpp_dec_float<50U,_int,_void> local_b38;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U>_>_>,_2UL>,_0UL>_>
  *local_b00;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  local_af8;
  basis local_8f8;
  unitcell local_8e0;
  cpp_dec_float<50U,_int,_void> local_8a8;
  cpp_dec_float<50U,_int,_void> local_868;
  undefined1 local_828 [8];
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  *pfStack_820;
  uint local_818 [3];
  undefined3 uStack_80b;
  uint local_808;
  undefined3 uStack_803;
  int local_800;
  bool local_7fc;
  undefined8 local_7f8;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  local_628;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
  local_428;
  undefined1 local_228 [16];
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  int local_200;
  bool local_1fc;
  fpclass_type local_1f8;
  int32_t iStack_1f4;
  
  pnVar11 = (type)CONCAT44(in_register_0000000c,Ly);
  local_bb8 = (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
               *)Jy;
  local_b00 = __return_storage_ptr__;
  if (((int)this == 0) || (Lx == 0)) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Lx and Ly should be positive");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lattice::basis::simple(&local_8f8,2);
  local_8e0.dim_ = 2;
  local_8e0.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8e0.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8e0.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8e0.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8e0.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8e0.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
  pvVar7 = calloc(1,0x10);
  if (pvVar7 == (void *)0x0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = dup2;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = (uint)pvVar7;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] =
       (uint)((ulong)pvVar7 >> 0x20);
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 2;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
  lattice::unitcell::add_site(&local_8e0,(coordinate_t *)&local_428,0);
  free((void *)CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1],
                        local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0]));
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
  puVar8 = (undefined8 *)malloc(0x10);
  if (puVar8 != (undefined8 *)0x0) {
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = (uint)puVar8;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] =
         (uint)((ulong)puVar8 >> 0x20);
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 2;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
    *puVar8 = 1;
    puVar8[1] = 0;
    lattice::unitcell::add_bond(&local_8e0,0,0,(offset_t *)&local_428,0);
    free((void *)CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1],
                          local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0]));
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
    puVar8 = (undefined8 *)malloc(0x10);
    if (puVar8 == (undefined8 *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = dup2;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = (uint)puVar8;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] =
         (uint)((ulong)puVar8 >> 0x20);
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 2;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
    *puVar8 = 0;
    puVar8[1] = 1;
    lattice::unitcell::add_bond(&local_8e0,0,0,(offset_t *)&local_428,1);
    free((void *)CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1],
                          local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0]));
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
    local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
    Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<long,__1,__1,__1,_0> *)&local_428,4,2,2);
    __s = (ulong *)CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1],
                            local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0]);
    lVar12 = CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5],
                      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4]) *
             CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3],
                      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2]);
    if (0 < lVar12) {
      memset(__s,0,lVar12 * 8);
    }
    *__s = (ulong)this & 0xffffffff;
    __s[CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3],
                 local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2]) + 1] =
         (ulong)Lx;
    lattice::graph::graph(&local_b88,&local_8f8,&local_8e0,(span_t *)&local_428,periodic);
    free((void *)CONCAT44(local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1],
                          local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0]));
    if ((ulong)(((long)local_b88.sites_.
                       super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b88.sites_.
                       super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) < 0x20)
    {
      std::
      vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ::vector(&local_ba0,2,(allocator_type *)&local_428);
      *(undefined8 *)
       (((local_ba0.
          super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.data._M_elems + 8) =
           *(undefined8 *)((pnVar11->m_backend).data._M_elems + 8);
      uVar1 = *(undefined8 *)(pnVar11->m_backend).data._M_elems;
      uVar2 = *(undefined8 *)((pnVar11->m_backend).data._M_elems + 2);
      uVar3 = *(undefined8 *)((pnVar11->m_backend).data._M_elems + 6);
      *(undefined8 *)
       (((local_ba0.
          super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.data._M_elems + 4) =
           *(undefined8 *)((pnVar11->m_backend).data._M_elems + 4);
      *(undefined8 *)
       (((local_ba0.
          super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.data._M_elems + 6) = uVar3;
      *(undefined8 *)
       ((local_ba0.
         super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.data._M_elems = uVar1;
      *(undefined8 *)
       (((local_ba0.
          super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.data._M_elems + 2) = uVar2;
      ((local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.exp = (pnVar11->m_backend).exp;
      ((local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.neg = (pnVar11->m_backend).neg;
      iVar4 = (pnVar11->m_backend).prec_elem;
      ((local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.fpclass =
           (pnVar11->m_backend).fpclass;
      ((local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->base).m_backend.prec_elem = iVar4;
      uVar1 = *(undefined8 *)((Jx->base).m_backend.data._M_elems + 2);
      uVar2 = *(undefined8 *)((Jx->base).m_backend.data._M_elems + 4);
      uVar3 = *(undefined8 *)((Jx->base).m_backend.data._M_elems + 6);
      *(undefined8 *)
       local_ba0.
       super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.data._M_elems =
           *(undefined8 *)(Jx->base).m_backend.data._M_elems;
      *(undefined8 *)
       (local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.data._M_elems + 2) = uVar1;
      *(undefined8 *)
       (local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.data._M_elems + 4) = uVar2;
      *(undefined8 *)
       (local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.data._M_elems + 6) = uVar3;
      *(undefined8 *)
       (local_ba0.
        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.data._M_elems + 8) =
           *(undefined8 *)((Jx->base).m_backend.data._M_elems + 8);
      local_ba0.
      super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.exp = (Jx->base).m_backend.exp;
      local_ba0.
      super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.neg = (Jx->base).m_backend.neg;
      iVar4 = (Jx->base).m_backend.prec_elem;
      local_ba0.
      super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.fpclass =
           (Jx->base).m_backend.fpclass;
      local_ba0.
      super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1].base.m_backend.prec_elem = iVar4;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
      local_228._0_8_ = pnVar11;
      local_228._8_8_ = Jx;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_428,
                 (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_228,(add_immediates *)&local_628);
      local_228._0_8_ = &local_af8;
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0];
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg =
           (bool)((local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] != 0 ||
                  local_428.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass !=
                  cpp_dec_float_finite) ^ local_428.v._M_elems[0].v._M_elems[0].base.m_backend.neg);
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
      uVar6 = Lx * (int)this;
      local_228._8_4_ = uVar6;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
      local_428.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,unsigned_int,void,void>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                  *)&local_428,
                 (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_unsigned_int,_void,_void>
                  *)local_228,(multiply_immediates *)&local_628);
      local_8a8.data._M_elems[1] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1];
      local_8a8.data._M_elems[0] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0];
      local_8a8.data._M_elems[3] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3];
      local_8a8.data._M_elems[2] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2];
      local_8a8.data._M_elems[5] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
      local_8a8.data._M_elems[4] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
      local_8a8.data._M_elems[7] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
      local_8a8.data._M_elems[6] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
      local_8a8.data._M_elems[9] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
      local_8a8.data._M_elems[8] =
           local_428.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
      local_8a8.exp = local_428.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
      local_8a8.neg = local_428.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
      local_8a8.fpclass = local_428.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
      local_8a8.prec_elem = local_428.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
      uVar13 = (long)local_b88.sites_.
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b88.sites_.
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::fvar<int>(&local_428,(int *)&local_af8);
      local_c00 = (int)(uVar13 >> 3) * -0x49249249;
      local_c08 = 0;
      do {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_868,0,(type *)0x0);
        if (local_b88.bonds_.
            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_b88.bonds_.
            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar14 = 1;
          uVar13 = 0;
          do {
            local_bfc = uVar14;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)local_828,2,(type *)0x0);
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            local_b38.data._M_elems._0_8_ = (cpp_dec_float<50U,_int,_void> *)local_828;
            local_b38.data._M_elems[2] =
                 (uint)(((uint)local_c08 >>
                         ((uint)local_b88.bonds_.
                                super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].source & 0x1f) & 1
                        ) != 0);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,unsigned_int,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_unsigned_int,_void,_void>
                        *)&local_b38,(multiply_immediates *)local_bf8);
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.exp =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.neg =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            local_b38.data._M_elems._0_8_ = &local_628;
            local_b38.data._M_elems[2] = 1;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,int,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_int,_void,_void>
                        *)&local_b38,(subtract_immediates *)local_bf8);
            local_228._0_8_ =
                 CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1],
                          local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0]);
            local_228._8_8_ =
                 CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3],
                          local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2]);
            local_218[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_218[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            auStack_210[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
            auStack_210[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
            local_208[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
            local_208[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
            local_200 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_1fc = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_1f8 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            iStack_1f4 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_b38,2,(type *)0x0);
            local_bf8._0_8_ = &local_b38;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            local_bf8._8_4_ =
                 (uint)(((uint)local_c08 >>
                         ((uint)local_b88.bonds_.
                                super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].target & 0x1f) & 1
                        ) != 0);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,unsigned_int,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_unsigned_int,_void,_void>
                        *)local_bf8,(multiply_immediates *)&local_bb0);
            local_828._4_4_ = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1];
            local_828._0_4_ = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0];
            pfStack_820._4_4_ =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3];
            pfStack_820._0_4_ =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2];
            local_818[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_818[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            stack0xfffffffffffff7f0 =
                 (undefined5)
                 CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7],
                          local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6]);
            uStack_80b = (undefined3)
                         (local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] >> 8
                         );
            _local_808 = (undefined5)
                         CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems
                                  [9],local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data.
                                      _M_elems[8]);
            uStack_803 = (undefined3)
                         (local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] >> 8
                         );
            local_800 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_7fc = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_7f8._0_4_ = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            local_7f8._4_4_ = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            local_bf8._0_8_ = local_828;
            local_bf8._8_4_ = 1;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,int,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_int,_void,_void>
                        *)local_bf8,(subtract_immediates *)&local_bb0);
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.exp =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.neg =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            local_bf8._0_8_ =
                 local_ba0.
                 super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 local_b88.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].type;
            local_bf8._8_8_ = local_228;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)local_bf8,(multiply_immediates *)&local_bb0);
            uVar14 = local_bfc;
            local_b38.data._M_elems[1] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1];
            local_b38.data._M_elems[0] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0];
            local_b38.data._M_elems[3] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3];
            local_b38.data._M_elems[2] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2];
            local_b38.data._M_elems[5] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_b38.data._M_elems[4] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            local_b38.data._M_elems[7] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
            local_b38.data._M_elems[6] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
            local_b38.data._M_elems[9] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
            local_b38.data._M_elems[8] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
            local_b38.exp = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_b38.neg = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_b38.fpclass = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            local_b38.prec_elem = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            local_bf8._0_8_ = &local_b38;
            local_bf8._8_8_ = &local_628;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)local_bf8,(multiply_immediates *)&local_bb0);
            local_828 = (undefined1  [8])
                        CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems
                                 [1],local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data.
                                     _M_elems[0]);
            pfStack_820 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                           *)CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data.
                                      _M_elems[3],
                                      local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data.
                                      _M_elems[2]);
            local_818[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_818[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            stack0xfffffffffffff7f0 =
                 (undefined5)
                 CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7],
                          local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6]);
            uStack_80b = (undefined3)
                         (local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] >> 8
                         );
            _local_808 = (undefined5)
                         CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems
                                  [9],local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data.
                                      _M_elems[8]);
            uStack_803 = (undefined3)
                         (local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] >> 8
                         );
            local_800 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_7fc = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_7f8._0_4_ = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            local_7f8._4_4_ = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_868,(cpp_dec_float<50U,_int,_void> *)local_828);
            uVar13 = (ulong)uVar14;
            uVar9 = ((long)local_b88.bonds_.
                           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b88.bonds_.
                           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            uVar14 = uVar14 + 1;
          } while (uVar13 <= uVar9 && uVar9 - uVar13 != 0);
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_b38,0,(type *)0x0);
        if (local_b88.sites_.
            super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_b88.sites_.
            super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar13 = 0;
          do {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)local_828,2,(type *)0x0);
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            local_bf8._0_8_ = (cpp_dec_float<50U,_int,_void> *)local_828;
            local_bf8._8_4_ = (uint)(((uint)local_c08 >> ((uint)uVar13 & 0x1f) & 1) != 0);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,unsigned_int,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_unsigned_int,_void,_void>
                        *)local_bf8,(multiply_immediates *)&local_bb0);
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.exp =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.neg =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            local_628.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem =
                 local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            local_bf8._0_8_ = &local_628;
            local_bf8._8_4_ = 1;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass = cpp_dec_float_finite;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem = 10;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9] = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp = 0;
            local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg = false;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,int,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_af8,
                       (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_int,_void,_void>
                        *)local_bf8,(subtract_immediates *)&local_bb0);
            local_228._0_8_ =
                 CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[1],
                          local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[0]);
            local_228._8_8_ =
                 CONCAT44(local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[3],
                          local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[2]);
            local_218[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[5];
            local_218[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[4];
            auStack_210[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[7];
            auStack_210[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[6];
            local_208[1] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[9];
            local_208[0] = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.data._M_elems[8];
            local_200 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.exp;
            local_1fc = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.neg;
            local_1f8 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.fpclass;
            iStack_1f4 = local_af8.v._M_elems[0].v._M_elems[0].base.m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_b38,(cpp_dec_float<50U,_int,_void> *)local_228);
            uVar13 = (ulong)((uint)uVar13 + 1);
            uVar9 = ((long)local_b88.sites_.
                           super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b88.sites_.
                           super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
          } while (uVar13 <= uVar9 && uVar9 - uVar13 != 0);
        }
        local_bb0.arg1 = (type)&local_8a8;
        local_bb0.arg2 = (type)&local_868;
        local_7f8._0_4_ = cpp_dec_float_finite;
        local_7f8._4_4_ = 10;
        local_828 = (undefined1  [8])0x0;
        pfStack_820 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                       *)0x0;
        local_818[0] = 0;
        local_818[1] = 0;
        stack0xfffffffffffff7f0 = 0;
        uStack_80b = 0;
        _local_808 = 0;
        uStack_803 = 0;
        local_800 = 0;
        local_7fc = false;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)local_828,&local_bb0,&local_c09);
        auStack_be0[1]._1_3_ = uStack_80b;
        auStack_be0._0_5_ = stack0xfffffffffffff7f0;
        local_bf8._0_8_ = local_828;
        local_bf8._8_8_ = pfStack_820;
        local_be8[0] = local_818[0];
        local_be8[1] = local_818[1];
        local_bd8[1]._1_3_ = uStack_803;
        local_bd8._0_5_ = _local_808;
        local_bd0 = local_800;
        local_bcc = local_7fc;
        local_bc8 = (fpclass_type)local_7f8;
        iStack_bc4 = local_7f8._4_4_;
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
        ::operator*((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                     *)local_828,
                    (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                     *)beta,(root_type *)&local_b38);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
        ::operator-((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_0UL>
                     *)local_828);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)&local_628,
                   (cpp_dec_float<50U,_int,_void> *)local_bf8);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>
        ::operator*((promote<fvar<fvar<mp_wrapper<number<cpp_dec_float<50U>_>_>,_2UL>,_0UL>,_fvar<mp_wrapper<number<cpp_dec_float<50U,_int,_void>,_(expression_template_option)1>_>,_2UL>_>
                     *)local_228,
                    (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,0ul>
                     *)&local_628,local_bb8);
        boost::math::differentiation::autodiff_v1::detail::
        exp<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                  (&local_af8,(detail *)local_228,cr);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
        ::operator+=((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                      *)&local_428,&local_af8);
        uVar14 = (int)local_c08 + 1;
        local_c08 = (ulong)uVar14;
      } while (uVar14 >> ((byte)local_c00 & 0x1f) == 0);
      boost::math::differentiation::autodiff_v1::detail::
      log<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                  *)local_828,(detail *)&local_428,cr_00);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::operator-(&local_628,
                  (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
                   *)local_828);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
      ::operator/((promote<fvar<fvar<mp_wrapper<number<cpp_dec_float<50U>_>_>,_2UL>,_2UL>,_fvar<mp_wrapper<number<cpp_dec_float<50U,_int,_void>,_(expression_template_option)1>_>,_2UL>_>
                   *)local_228,
                  (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>,2ul>
                   *)&local_628,local_bb8);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::fvar(&local_af8,
             (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
              *)local_228);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                ((cpp_dec_float<50U,_int,_void> *)&local_af8,&local_8a8);
      local_868.fpclass = cpp_dec_float_finite;
      local_868.prec_elem = 10;
      local_868.data._M_elems[0] = 0;
      local_868.data._M_elems[1] = 0;
      local_868.data._M_elems[2] = 0;
      local_868.data._M_elems[3] = 0;
      local_868.data._M_elems[4] = 0;
      local_868.data._M_elems[5] = 0;
      local_868.data._M_elems._24_5_ = 0;
      local_868.data._M_elems[7]._1_3_ = 0;
      local_868.data._M_elems._32_5_ = 0;
      local_868._37_8_ = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::from_unsigned_long_long
                (&local_868,(ulong)uVar6);
      ppVar5 = local_b00;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>,_2UL>
      ::operator/(local_b00,&local_af8,(root_type *)&local_868);
      if (local_ba0.
          super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_ba0.
                        super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_ba0.
                              super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_ba0.
                              super__Vector_base<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b88.bonds_.
          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b88.bonds_.
                        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b88.bonds_.
                              super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b88.bonds_.
                              super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&local_b88.coordinates_);
      std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
                (&local_b88.sites_);
      std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::~vector
                (&local_8e0.bonds_);
      std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::~vector
                (&local_8e0.sites_);
      free(local_8f8.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      return ppVar5;
    }
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"too large system size");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = dup2;
  __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

inline boost::math::differentiation::promote<U, W> finite_count(I Lx, I Ly,
                                                                T Jx, T Jy,
                                                                U beta, W h) {
  typedef I int_t;
  typedef T real_t;
  typedef boost::math::differentiation::promote<U, W> value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));

  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 1);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_sites() >= 32)
    throw(std::invalid_argument("too large system size"));

  std::vector<real_t> J(2);
  J[0] = Jx;
  J[1] = Jy;
  real_t gs_energy = -(Jx + Jy) * (Lx * Ly);
  int_t num_states = 1 << graph.num_sites();
  value_t Z(0);
  for (int_t c = 0; c < num_states; ++c) {
    real_t energy = 0;
    for (int_t b = 0; b < graph.num_bonds(); ++b) {
      real_t ci = real_t(2) * ((c >> graph.source(b)) & 1) - 1;
      real_t cj = real_t(2) * ((c >> graph.target(b)) & 1) - 1;
      energy -= J[graph.bond_type(b)] * ci * cj;
    }
    real_t mag = 0;
    for (int_t s = 0; s < graph.num_sites(); ++s) {
      mag += real_t(2) * ((c >> s) & 1) - 1;
    }
    Z += exp((gs_energy - energy - h * mag) * beta);
  }
  return (-log(Z) / beta + gs_energy) / (Lx * Ly);
}